

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

void exp2reg(FuncState *fs,expdesc *e,int reg)

{
  int iVar1;
  int local_30;
  int local_28;
  int fj;
  int p_t;
  int p_f;
  int final;
  int reg_local;
  expdesc *e_local;
  FuncState *fs_local;
  
  discharge2reg(fs,e,reg);
  if (e->k == VJMP) {
    luaK_concat(fs,&e->t,(e->u).info);
  }
  if (e->t == e->f) goto LAB_0010895d;
  fj = -1;
  local_28 = -1;
  iVar1 = need_value(fs,e->t);
  if (iVar1 == 0) {
    iVar1 = need_value(fs,e->f);
    if (iVar1 != 0) goto LAB_001088c0;
  }
  else {
LAB_001088c0:
    if (e->k == VJMP) {
      local_30 = -1;
    }
    else {
      local_30 = luaK_jump(fs);
    }
    fj = code_loadbool(fs,reg,0,1);
    local_28 = code_loadbool(fs,reg,1,0);
    luaK_patchtohere(fs,local_30);
  }
  iVar1 = luaK_getlabel(fs);
  patchlistaux(fs,e->f,iVar1,reg,fj);
  patchlistaux(fs,e->t,iVar1,reg,local_28);
LAB_0010895d:
  e->t = -1;
  e->f = -1;
  (e->u).info = reg;
  e->k = VNONRELOC;
  return;
}

Assistant:

static void exp2reg (FuncState *fs, expdesc *e, int reg) {
  discharge2reg(fs, e, reg);
  if (e->k == VJMP)  /* expression itself is a test? */
    luaK_concat(fs, &e->t, e->u.info);  /* put this jump in 't' list */
  if (hasjumps(e)) {
    int final;  /* position after whole expression */
    int p_f = NO_JUMP;  /* position of an eventual LOAD false */
    int p_t = NO_JUMP;  /* position of an eventual LOAD true */
    if (need_value(fs, e->t) || need_value(fs, e->f)) {
      int fj = (e->k == VJMP) ? NO_JUMP : luaK_jump(fs);
      p_f = code_loadbool(fs, reg, 0, 1);
      p_t = code_loadbool(fs, reg, 1, 0);
      luaK_patchtohere(fs, fj);
    }
    final = luaK_getlabel(fs);
    patchlistaux(fs, e->f, final, reg, p_f);
    patchlistaux(fs, e->t, final, reg, p_t);
  }
  e->f = e->t = NO_JUMP;
  e->u.info = reg;
  e->k = VNONRELOC;
}